

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

assetsys_t * assetsys_create(void *memctx)

{
  void *pvVar1;
  undefined1 local_40 [8];
  strpool_config_t config;
  assetsys_t *sys;
  void *memctx_local;
  
  config._32_8_ = malloc(0x1b0);
  *(void **)config._32_8_ = memctx;
  memset(local_40,0,0x28);
  config.memctx._4_4_ = 0x20;
  config.ignore_case = 0x20;
  config.counter_bits = 0x1000;
  config.index_bits = 0x20;
  config.entry_capacity = 0x40000;
  config.block_capacity = 0x17;
  local_40 = (undefined1  [8])memctx;
  strpool_init((strpool_t *)(config._32_8_ + 8),(strpool_config_t *)local_40);
  *(undefined4 *)(config._32_8_ + 0x90) = 0;
  *(undefined4 *)(config._32_8_ + 0x94) = 0x10;
  pvVar1 = malloc((long)*(int *)(config._32_8_ + 0x94) * 0x98);
  *(void **)(config._32_8_ + 0x88) = pvVar1;
  *(undefined4 *)(config._32_8_ + 0xa0) = 0;
  *(undefined4 *)(config._32_8_ + 0xa4) = 0x4000;
  pvVar1 = malloc((long)*(int *)(config._32_8_ + 0xa4) * 0x18);
  *(void **)(config._32_8_ + 0x98) = pvVar1;
  return (assetsys_t *)config._32_8_;
}

Assistant:

assetsys_t* assetsys_create( void* memctx )
    {
    assetsys_t* sys = (assetsys_t*) ASSETSYS_MALLOC( memctx, sizeof( assetsys_t ) );
    sys->memctx = memctx;

    strpool_config_t config = strpool_default_config;
    config.memctx = memctx;
    strpool_init( &sys->strpool, &config );

    sys->mounts_count = 0;
    sys->mounts_capacity = 16;
    sys->mounts = (struct assetsys_internal_mount_t*) ASSETSYS_MALLOC( memctx, 
        sizeof( *sys->mounts ) * sys->mounts_capacity );

    sys->collated_count = 0;
    sys->collated_capacity = 16384;
    sys->collated = (struct assetsys_internal_collated_t*) ASSETSYS_MALLOC( memctx, 
        sizeof( *sys->collated ) * sys->collated_capacity );
    return sys;
    }